

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<bool>::internalSetData<std::__cxx11::string>
          (Parameter<bool> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  bool bVar1;
  string *in_RSI;
  long in_RDI;
  bool result;
  bool tmp;
  RepType_conflict *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,in_RSI);
  bVar1 = ParameterTraits<bool>::convert(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    *(undefined1 *)(in_RDI + 0x2b) = 0;
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }